

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::ArgumentSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *args)

{
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *this_00;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)allocate(this,0x30,8);
  slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::SeparatedSyntaxList
            (this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }